

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O2

void __thiscall DiscreteSpaceInformation::~DiscreteSpaceInformation(DiscreteSpaceInformation *this)

{
  pointer ppiVar1;
  int *piVar2;
  uint uVar3;
  
  this->_vptr_DiscreteSpaceInformation = (_func_int **)&PTR___cxa_pure_virtual_0010bc70;
  uVar3 = 0;
  while( true ) {
    ppiVar1 = (this->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppiVar1 >> 3) <=
        (ulong)uVar3) break;
    piVar2 = ppiVar1[uVar3];
    if (piVar2 != (int *)0x0) {
      operator_delete__(piVar2);
    }
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<int_*,_std::allocator<int_*>_>::~_Vector_base
            (&(this->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>);
  return;
}

Assistant:

virtual ~DiscreteSpaceInformation()
    {
        SBPL_PRINTF("destroying discretespaceinformation\n");
        for (unsigned int i = 0; i < StateID2IndexMapping.size(); ++i) {
            if (StateID2IndexMapping[i] != NULL) delete[] StateID2IndexMapping[i];
        }
        SBPL_FCLOSE(fDeb);
    }